

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O3

void set_avg_ext(rand_gen *gen,double avg)

{
  if (gen->gen_type != 1) {
    if (gen->gen_type != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                    ,0x17f,"void set_avg_ext(struct rand_gen *, double)");
    }
    avg = 1.0 / avg;
  }
  (gen->params).p2.a = avg;
  return;
}

Assistant:

void set_avg_ext(struct rand_gen *gen, double avg)
{
	switch (gen->gen_type) {
	case GEN_FIXED:
		fixed_set_avg(gen, avg);
		break;
	case GEN_EXP:
		exp_set_avg(gen, avg);
		break;
	default:
		assert(0);
	}
}